

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O0

void Rml::ElementStyle::TransitionPropertyChanges
               (Element *element,PropertyIdSet *properties,PropertyDictionary *inline_properties,
               ElementDefinition *old_definition,ElementDefinition *new_definition)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  Property *this;
  Type TVar4;
  TransitionList *pTVar5;
  const_reference __src;
  reference transition_00;
  Transition *transition_1;
  const_iterator __end4;
  const_iterator __begin4;
  Vector<Transition> *__range4;
  PropertyIdSetIterator local_b8;
  undefined1 local_a8 [8];
  PropertyIdSetIterator it;
  Transition transition;
  anon_class_32_4_efda7985 add_transition;
  TransitionList *transition_list;
  Property *transition_property;
  ElementDefinition *new_definition_local;
  ElementDefinition *old_definition_local;
  PropertyDictionary *inline_properties_local;
  PropertyIdSet *properties_local;
  Element *element_local;
  
  properties_local = (PropertyIdSet *)element;
  if ((element == (Element *)0x0) &&
     (bVar2 = Assert("RMLUI_ASSERT(element)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementStyle.cpp"
                     ,0x75), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if (((((old_definition != (ElementDefinition *)0x0) &&
        (new_definition != (ElementDefinition *)0x0)) &&
       (bVar2 = PropertyIdSet::Empty(properties), !bVar2)) &&
      ((this = GetLocalProperty(Transition,inline_properties,new_definition),
       this != (Property *)0x0 && (TVar4 = Variant::GetType(&this->value), TVar4 == TRANSITIONLIST))
      )) && (pTVar5 = Variant::GetReference<Rml::TransitionList>(&this->value),
            (pTVar5->none & 1U) == 0)) {
    if ((TransitionPropertyChanges(Rml::Element*,Rml::PropertyIdSet&,Rml::PropertyDictionary_const&,Rml::ElementDefinition_const*,Rml::ElementDefinition_const*)
         ::empty_properties == '\0') &&
       (iVar3 = __cxa_guard_acquire(&TransitionPropertyChanges(Rml::Element*,Rml::PropertyIdSet&,Rml::PropertyDictionary_const&,Rml::ElementDefinition_const*,Rml::ElementDefinition_const*)
                                     ::empty_properties), iVar3 != 0)) {
      PropertyDictionary::PropertyDictionary(&TransitionPropertyChanges::empty_properties);
      __cxa_atexit(PropertyDictionary::~PropertyDictionary,
                   &TransitionPropertyChanges::empty_properties,&__dso_handle);
      __cxa_guard_release(&TransitionPropertyChanges(Rml::Element*,Rml::PropertyIdSet&,Rml::PropertyDictionary_const&,Rml::ElementDefinition_const*,Rml::ElementDefinition_const*)
                           ::empty_properties);
    }
    transition._32_8_ = &properties_local;
    if ((pTVar5->all & 1U) == 0) {
      __end4 = ::std::vector<Rml::Transition,_std::allocator<Rml::Transition>_>::begin
                         (&pTVar5->transitions);
      transition_1 = (Transition *)
                     ::std::vector<Rml::Transition,_std::allocator<Rml::Transition>_>::end
                               (&pTVar5->transitions);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_Rml::Transition_*,_std::vector<Rml::Transition,_std::allocator<Rml::Transition>_>_>
                                         *)&transition_1), bVar2) {
        transition_00 =
             __gnu_cxx::
             __normal_iterator<const_Rml::Transition_*,_std::vector<Rml::Transition,_std::allocator<Rml::Transition>_>_>
             ::operator*(&__end4);
        bVar2 = PropertyIdSet::Contains(properties,transition_00->id);
        if ((bVar2) &&
           (bVar2 = TransitionPropertyChanges::anon_class_32_4_efda7985::operator()
                              ((anon_class_32_4_efda7985 *)&transition.reverse_adjustment_factor,
                               transition_00), bVar2)) {
          PropertyIdSet::Erase(properties,transition_00->id);
        }
        __gnu_cxx::
        __normal_iterator<const_Rml::Transition_*,_std::vector<Rml::Transition,_std::allocator<Rml::Transition>_>_>
        ::operator++(&__end4);
      }
    }
    else {
      __src = ::std::vector<Rml::Transition,_std::allocator<Rml::Transition>_>::operator[]
                        (&pTVar5->transitions,0);
      memcpy(&it.id_index,__src,0x28);
      _local_a8 = PropertyIdSet::begin(properties);
      while( true ) {
        local_b8 = PropertyIdSet::end(properties);
        bVar2 = PropertyIdSetIterator::operator!=((PropertyIdSetIterator *)local_a8,&local_b8);
        if (!bVar2) break;
        it.id_index._0_1_ = PropertyIdSetIterator::operator*((PropertyIdSetIterator *)local_a8);
        bVar2 = TransitionPropertyChanges::anon_class_32_4_efda7985::operator()
                          ((anon_class_32_4_efda7985 *)&transition.reverse_adjustment_factor,
                           (Transition *)&it.id_index);
        if (bVar2) {
          _local_a8 = PropertyIdSet::Erase(properties,_local_a8);
        }
        else {
          PropertyIdSetIterator::operator++((PropertyIdSetIterator *)local_a8);
        }
      }
    }
  }
  return;
}

Assistant:

void ElementStyle::TransitionPropertyChanges(Element* element, PropertyIdSet& properties, const PropertyDictionary& inline_properties,
	const ElementDefinition* old_definition, const ElementDefinition* new_definition)
{
	// Apply transition to relevant properties if a transition is defined on element.
	// Properties that are part of a transition are removed from the properties list.

	RMLUI_ASSERT(element);
	if (!old_definition || !new_definition || properties.Empty())
		return;

	// We get the local property instead of the computed value here, because we want to intercept property changes even before the computed values are
	// ready. Now that we have the concept of computed values, we may want do this operation directly on them instead.
	if (const Property* transition_property = GetLocalProperty(PropertyId::Transition, inline_properties, new_definition))
	{
		if (transition_property->value.GetType() != Variant::TRANSITIONLIST)
			return;

		const TransitionList& transition_list = transition_property->value.GetReference<TransitionList>();

		if (!transition_list.none)
		{
			static const PropertyDictionary empty_properties;

			auto add_transition = [&](const Transition& transition) {
				bool transition_added = false;
				const Property* start_value = GetProperty(transition.id, element, inline_properties, old_definition);
				const Property* target_value = GetProperty(transition.id, element, empty_properties, new_definition);
				if (start_value && target_value && (*start_value != *target_value))
					transition_added = element->StartTransition(transition, *start_value, *target_value);
				return transition_added;
			};

			if (transition_list.all)
			{
				Transition transition = transition_list.transitions[0];
				for (auto it = properties.begin(); it != properties.end();)
				{
					transition.id = *it;
					if (add_transition(transition))
						it = properties.Erase(it);
					else
						++it;
				}
			}
			else
			{
				for (const Transition& transition : transition_list.transitions)
				{
					if (properties.Contains(transition.id))
					{
						if (add_transition(transition))
							properties.Erase(transition.id);
					}
				}
			}
		}
	}
}